

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O1

void __thiscall slang::ast::SpecparamSymbol::resolvePathPulse(SpecparamSymbol *this)

{
  long *plVar1;
  Scope *parent;
  SpecparamSymbol *pSVar2;
  Diagnostic *this_00;
  Symbol *pSVar3;
  long lVar4;
  size_type __n;
  ulong __n_00;
  ulong uVar5;
  ulong uVar6;
  SpecparamSymbol *this_01;
  SourceLocation loc;
  SpecparamSymbol *__s;
  string_view arg;
  string_view terminalName;
  string_view terminalName_00;
  SourceRange sourceRange;
  
  this->pathPulseResolved = true;
  if ((((this->isPathPulse == true) &&
       (__n_00 = (this->super_ValueSymbol).super_Symbol.name._M_len, 9 < __n_00)) &&
      (plVar1 = (long *)(this->super_ValueSymbol).super_Symbol.name._M_str,
      (short)plVar1[1] == 0x2445 && *plVar1 == 0x534c555048544150)) &&
     (parent = (this->super_ValueSymbol).super_Symbol.parentScope,
     parent->thisSym->kind == SpecifyBlock)) {
    if (__n_00 < 10) {
      lVar4 = 10;
LAB_002efaff:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 lVar4,__n_00);
    }
    __n_00 = __n_00 - 10;
    if (__n_00 != 0) {
      __s = (SpecparamSymbol *)((long)plVar1 + 10);
      loc = (SourceLocation)((long)(this->super_ValueSymbol).super_Symbol.location + 0xa0000000);
      this_01 = __s;
      pSVar2 = (SpecparamSymbol *)memchr(__s,0x24,__n_00);
      uVar5 = (long)pSVar2 - (long)__s;
      if (uVar5 != 0xffffffffffffffff && pSVar2 != (SpecparamSymbol *)0x0) {
        lVar4 = uVar5 + 1;
        uVar6 = uVar5;
        if (__n_00 < uVar5) {
          uVar6 = __n_00;
        }
        if (__n_00 <= uVar5) goto LAB_002efaff;
        terminalName_00._M_len = __n_00 - lVar4;
        if (pSVar2 != __s && terminalName_00._M_len != 0) {
          terminalName_00._M_str = (char *)(lVar4 + (long)__s);
          terminalName._M_str = (char *)__s;
          terminalName._M_len = uVar6;
          pSVar3 = resolvePathTerminal(this_01,terminalName,parent,loc,true);
          this->pathSource = pSVar3;
          pSVar3 = resolvePathTerminal(this_01,terminalName_00,parent,
                                       (SourceLocation)(uVar6 * 0x10000000 + (long)loc),false);
          this->pathDest = pSVar3;
          return;
        }
      }
      sourceRange.endLoc = (SourceLocation)(__n_00 * 0x10000000 + (long)loc);
      sourceRange.startLoc = loc;
      this_00 = Scope::addDiag(parent,(DiagCode)0x9a0006,sourceRange);
      arg._M_str = (char *)__s;
      arg._M_len = __n_00;
      Diagnostic::operator<<(this_00,arg);
      return;
    }
  }
  return;
}

Assistant:

void SpecparamSymbol::resolvePathPulse() const {
    pathPulseResolved = true;
    if (!isPathPulse)
        return;

    auto parent = getParentScope();
    SLANG_ASSERT(parent);

    auto prefix = "PATHPULSE$"sv;
    if (name.starts_with(prefix) && parent->asSymbol().kind == SymbolKind::SpecifyBlock) {
        auto path = name.substr(prefix.length());
        if (!path.empty()) {
            auto loc = location + prefix.length();
            auto nameError = [&] {
                parent->addDiag(diag::PathPulseInvalidPathName,
                                SourceRange{loc, loc + path.length()})
                    << path;
            };

            auto index = path.find('$');
            if (index == std::string_view::npos) {
                nameError();
                return;
            }

            auto source = path.substr(0, index);
            auto dest = path.substr(index + 1);
            if (source.empty() || dest.empty()) {
                nameError();
                return;
            }

            pathSource = resolvePathTerminal(source, *parent, loc,
                                             /* isSource */ true);
            pathDest = resolvePathTerminal(dest, *parent, loc + source.length(),
                                           /* isSource */ false);
        }
    }
}